

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

void x86_cpuid(int level,uint *out)

{
  uint *unaff_retaddr;
  undefined4 in_stack_00000010;
  uint *in_stack_00000018;
  uint in_stack_00000020;
  
  __get_cpuid(in_stack_00000020,in_stack_00000018,(uint *)CONCAT44(level,in_stack_00000010),out,
              unaff_retaddr);
  return;
}

Assistant:

static inline void x86_cpuid(int level, unsigned int out[4])
{
#if defined(_MSC_VER) && !defined(__clang__)
    __cpuid((int*)out, level);
#elif defined(__clang__) || defined(__GNUC__)
    __get_cpuid(level, out, out + 1, out + 2, out + 3);
#else
    NCNN_LOGE("x86_cpuid is unknown for current compiler");
    out[0] = 0;
    out[1] = 0;
    out[2] = 0;
    out[3] = 0;
#endif
}